

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_filter_dealloc(AV1LfSync *lf_sync)

{
  void *in_RDI;
  int i;
  int j;
  int in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != (void *)0x0) {
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      if (*(long *)((long)in_RDI + (long)iVar1 * 8) != 0) {
        for (in_stack_fffffffffffffff0 = 0;
            in_stack_fffffffffffffff0 < *(int *)((long)in_RDI + 0x4c);
            in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
          pthread_mutex_destroy
                    ((pthread_mutex_t *)
                     (*(long *)((long)in_RDI + (long)iVar1 * 8) +
                     (long)in_stack_fffffffffffffff0 * 0x28));
        }
        aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      }
      if (*(long *)((long)in_RDI + (long)iVar1 * 8 + 0x18) != 0) {
        for (in_stack_fffffffffffffff0 = 0;
            in_stack_fffffffffffffff0 < *(int *)((long)in_RDI + 0x4c);
            in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 + 1) {
          pthread_cond_destroy
                    ((pthread_cond_t *)
                     (*(long *)((long)in_RDI + (long)iVar1 * 8 + 0x18) +
                     (long)in_stack_fffffffffffffff0 * 0x30));
        }
        aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      }
    }
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      pthread_mutex_destroy(*(pthread_mutex_t **)((long)in_RDI + 0x60));
      aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    memset(in_RDI,0,0x80);
  }
  return;
}

Assistant:

void av1_loop_filter_dealloc(AV1LfSync *lf_sync) {
  if (lf_sync != NULL) {
    int j;
#if CONFIG_MULTITHREAD
    int i;
    for (j = 0; j < MAX_MB_PLANE; j++) {
      if (lf_sync->mutex_[j] != NULL) {
        for (i = 0; i < lf_sync->rows; ++i) {
          pthread_mutex_destroy(&lf_sync->mutex_[j][i]);
        }
        aom_free(lf_sync->mutex_[j]);
      }
      if (lf_sync->cond_[j] != NULL) {
        for (i = 0; i < lf_sync->rows; ++i) {
          pthread_cond_destroy(&lf_sync->cond_[j][i]);
        }
        aom_free(lf_sync->cond_[j]);
      }
    }
    if (lf_sync->job_mutex != NULL) {
      pthread_mutex_destroy(lf_sync->job_mutex);
      aom_free(lf_sync->job_mutex);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(lf_sync->lfdata);
    for (j = 0; j < MAX_MB_PLANE; j++) {
      aom_free(lf_sync->cur_sb_col[j]);
    }

    aom_free(lf_sync->job_queue);
    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*lf_sync);
  }
}